

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O3

match_result_t * __thiscall
zmq::radix_tree_t::match
          (match_result_t *__return_storage_ptr__,radix_tree_t *this,uchar *key_,size_t key_size_,
          bool is_lookup_)

{
  uint uVar1;
  uchar uVar2;
  node_t current_;
  node_t nVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t index_;
  size_t parent_edge_index_;
  node_t parent_;
  node_t grandparent_;
  size_t sVar9;
  size_t key_bytes_matched_;
  node_t current_node;
  
  if (key_ == (uchar *)0x0) {
    match();
  }
  nVar3._data = (this->_root)._data;
  uVar6 = 0;
  sVar9 = 0;
  index_ = 0;
  parent_edge_index_ = 0;
  current_._data = nVar3._data;
  parent_._data = nVar3._data;
  do {
    grandparent_._data = parent_._data;
    parent_._data = current_._data;
    sVar4 = index_;
    current_._data = nVar3._data;
    uVar8 = (ulong)*(uint *)(current_._data + 4);
    sVar5 = sVar4;
    current_node._data = current_._data;
    if (uVar8 == 0) {
      uVar8 = uVar6;
      key_bytes_matched_ = sVar9;
      if (*(int *)(current_._data + 8) == 0) {
LAB_001f5021:
        match_result_t::match_result_t
                  (__return_storage_ptr__,key_bytes_matched_,uVar8,sVar5,parent_edge_index_,current_
                   ,parent_,grandparent_);
        return __return_storage_ptr__;
      }
      uVar8 = 0;
LAB_001f4f67:
      uVar7 = 0;
      uVar6 = uVar8;
    }
    else {
      if (key_size_ <= sVar9) goto LAB_001f4f67;
      uVar7 = 0;
      while (uVar6 = uVar8, current_._data[uVar7 + 0xc] == key_[sVar9]) {
        uVar7 = uVar7 + 1;
        sVar9 = sVar9 + 1;
        if ((uVar8 <= uVar7) || (key_size_ <= sVar9)) break;
      }
    }
    if (((uVar7 == uVar6 && is_lookup_) &&
        (uVar8 = uVar6, key_bytes_matched_ = key_size_, *(int *)current_._data != 0)) ||
       (((uVar8 = uVar7, key_bytes_matched_ = sVar9, uVar7 != uVar6 || (sVar9 == key_size_)) ||
        (uVar1 = *(uint *)(current_._data + 8), uVar8 = uVar6, (ulong)uVar1 == 0))))
    goto LAB_001f5021;
    index_ = 0;
    while (uVar2 = node_t::first_byte_at(&current_node,index_), uVar2 != key_[sVar9]) {
      index_ = index_ + 1;
      if (uVar1 == index_) goto LAB_001f5021;
    }
    nVar3 = node_t::node_at(&current_node,index_);
    sVar5 = index_;
    parent_edge_index_ = sVar4;
    if (nVar3._data == current_._data) goto LAB_001f5021;
  } while( true );
}

Assistant:

match_result_t zmq::radix_tree_t::match (const unsigned char *key_,
                                         size_t key_size_,
                                         bool is_lookup_ = false) const
{
    zmq_assert (key_);

    // Node we're currently at in the traversal and its predecessors.
    node_t current_node = _root;
    node_t parent_node = current_node;
    node_t grandparent_node = current_node;
    // Index of the next byte to match in the key.
    size_t key_byte_index = 0;
    // Index of the next byte to match in the current node's prefix.
    size_t prefix_byte_index = 0;
    // Index of the edge from parent to current node.
    size_t edge_index = 0;
    // Index of the edge from grandparent to parent.
    size_t parent_edge_index = 0;

    while (current_node.prefix_length () > 0 || current_node.edgecount () > 0) {
        const unsigned char *const prefix = current_node.prefix ();
        const size_t prefix_length = current_node.prefix_length ();

        for (prefix_byte_index = 0;
             prefix_byte_index < prefix_length && key_byte_index < key_size_;
             ++prefix_byte_index, ++key_byte_index) {
            if (prefix[prefix_byte_index] != key_[key_byte_index])
                break;
        }

        // Even if a prefix of the key matches and we're doing a
        // lookup, this means we've found a matching subscription.
        if (is_lookup_ && prefix_byte_index == prefix_length
            && current_node.refcount () > 0) {
            key_byte_index = key_size_;
            break;
        }

        // There was a mismatch or we've matched the whole key, so
        // there's nothing more to do.
        if (prefix_byte_index != prefix_length || key_byte_index == key_size_)
            break;

        // We need to match the rest of the key. Check if there's an
        // outgoing edge from this node.
        node_t next_node = current_node;
        for (size_t i = 0, edgecount = current_node.edgecount (); i < edgecount;
             ++i) {
            if (current_node.first_byte_at (i) == key_[key_byte_index]) {
                parent_edge_index = edge_index;
                edge_index = i;
                next_node = current_node.node_at (i);
                break;
            }
        }

        if (next_node == current_node)
            break; // No outgoing edge.
        grandparent_node = parent_node;
        parent_node = current_node;
        current_node = next_node;
    }

    return match_result_t (key_byte_index, prefix_byte_index, edge_index,
                           parent_edge_index, current_node, parent_node,
                           grandparent_node);
}